

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

int amrex::CRRBetweenLevels(int fromlevel,int tolevel,Vector<int,_std::allocator<int>_> *refratios)

{
  int *piVar1;
  Vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  int in_EDI;
  int rr;
  int level;
  int iVar2;
  
  iVar2 = 1;
  for (; in_EDI < in_ESI; in_EDI = in_EDI + 1) {
    piVar1 = Vector<int,_std::allocator<int>_>::operator[](in_RDX,CONCAT44(in_EDI,iVar2));
    iVar2 = *piVar1 * iVar2;
  }
  return iVar2;
}

Assistant:

int amrex::CRRBetweenLevels(int fromlevel, int tolevel,
                            const Vector<int> &refratios)
{
  BL_ASSERT(fromlevel >= 0);
  BL_ASSERT(tolevel >= fromlevel);
  BL_ASSERT(tolevel <= refratios.size());
  int level, rr = 1;
  for(level = fromlevel; level < tolevel; ++level) {
    rr *= refratios[level];
  }
  return rr;
}